

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiTable * __thiscall ImPool<ImGuiTable>::Add(ImPool<ImGuiTable> *this)

{
  int iVar1;
  int iVar2;
  ImGuiTable *__src;
  ImGuiTable *__dest;
  ImGuiID IVar3;
  ImGuiID IVar4;
  
  iVar1 = this->FreeIdx;
  if (iVar1 == (this->Buf).Size) {
    IVar3 = iVar1 + 1;
    iVar2 = (this->Buf).Capacity;
    if (iVar1 < iVar2) {
      __dest = (this->Buf).Data;
      IVar4 = IVar3;
    }
    else {
      if (iVar2 == 0) {
        IVar4 = 8;
      }
      else {
        IVar4 = iVar2 / 2 + iVar2;
      }
      if ((int)IVar4 <= (int)IVar3) {
        IVar4 = IVar3;
      }
      __dest = (ImGuiTable *)ImGui::MemAlloc((long)(int)IVar4 * 0x208);
      __src = (this->Buf).Data;
      if (__src != (ImGuiTable *)0x0) {
        memcpy(__dest,__src,(long)(this->Buf).Size * 0x208);
        ImGui::MemFree((this->Buf).Data);
      }
      (this->Buf).Data = __dest;
      (this->Buf).Capacity = IVar4;
      IVar4 = this->FreeIdx + 1;
    }
    (this->Buf).Size = IVar3;
  }
  else {
    __dest = (this->Buf).Data;
    IVar4 = __dest[iVar1].ID;
  }
  this->FreeIdx = IVar4;
  memset(__dest + iVar1,0,0x208);
  __dest[iVar1].LastFrameActive = -1;
  this->AliveCount = this->AliveCount + 1;
  return (this->Buf).Data + iVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }